

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::analysis::TypeManager::FindPointerToType
          (TypeManager *this,uint32_t type_id,StorageClass storage_class)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l;
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  StorageClass SVar4;
  Type *type;
  IRContext *pIVar5;
  Instruction *pIVar6;
  TypeManager *this_00;
  Operand *local_1a0;
  allocator<spvtools::opt::Operand> local_18d;
  uint32_t local_18c;
  iterator local_188;
  undefined8 local_180;
  SmallVector<unsigned_int,_2UL> local_178;
  StorageClass local_14c;
  StorageClass *local_148;
  undefined8 local_140;
  SmallVector<unsigned_int,_2UL> local_138;
  Operand local_110;
  Operand OStack_e0;
  iterator local_b0;
  _func_int **local_a8;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_a0;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_88;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> type_inst
  ;
  uint32_t resultId;
  Instruction *type_inst_1;
  undefined1 local_68 [8];
  inst_iterator type_itr;
  Pointer pointerTy;
  Type *pointeeTy;
  StorageClass storage_class_local;
  uint32_t type_id_local;
  TypeManager *this_local;
  
  type = GetType(this,type_id);
  Pointer::Pointer((Pointer *)&type_itr,type,storage_class);
  pIVar5 = context(this);
  IRContext::module(pIVar5);
  Module::types_values_begin((Module *)local_68);
  do {
    pIVar5 = context(this);
    IRContext::module(pIVar5);
    Module::types_values_end((Module *)&type_inst_1);
    bVar1 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)local_68,
                              (iterator_template<spvtools::opt::Instruction> *)&type_inst_1);
    if (!bVar1) {
      pIVar5 = context(this);
      type_inst._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._0_4_ =
           IRContext::TakeNextId(pIVar5);
      if ((uint32_t)
          type_inst._M_t.
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl == 0) {
        this_local._4_4_ = 0;
        type_inst._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = 1;
      }
      else {
        pIVar6 = (Instruction *)::operator_new(0x70);
        pIVar5 = context(this);
        uVar3 = (uint32_t)
                type_inst._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        local_148 = &local_14c;
        local_140 = 1;
        init_list_00._M_len = 1;
        init_list_00._M_array = local_148;
        local_14c = storage_class;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_138,init_list_00);
        Operand::Operand(&local_110,SPV_OPERAND_TYPE_STORAGE_CLASS,&local_138);
        local_188 = &local_18c;
        local_180 = 1;
        init_list._M_len = 1;
        init_list._M_array = local_188;
        local_18c = type_id;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_178,init_list);
        Operand::Operand(&OStack_e0,SPV_OPERAND_TYPE_ID,&local_178);
        local_b0 = &local_110;
        local_a8 = (_func_int **)0x2;
        std::allocator<spvtools::opt::Operand>::allocator(&local_18d);
        __l._M_len = (size_type)local_a8;
        __l._M_array = local_b0;
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                  (&local_a0,__l,&local_18d);
        opt::Instruction::Instruction(pIVar6,pIVar5,OpTypePointer,0,uVar3,&local_a0);
        std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
        ::unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                  ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                    *)&local_88,pIVar6);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  (&local_a0);
        std::allocator<spvtools::opt::Operand>::~allocator(&local_18d);
        local_1a0 = (Operand *)&local_b0;
        do {
          local_1a0 = local_1a0 + -1;
          Operand::~Operand(local_1a0);
        } while (local_1a0 != &local_110);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_178);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_138);
        pIVar5 = context(this);
        IRContext::AddType(pIVar5,&local_88);
        pIVar5 = context(this);
        this_00 = IRContext::get_type_mgr(pIVar5);
        RegisterType(this_00,(uint32_t)
                             type_inst._M_t.
                             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                             _M_head_impl,(Type *)&type_itr);
        this_local._4_4_ =
             (uint32_t)
             type_inst._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        type_inst._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = 1;
        std::
        unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
        ~unique_ptr(&local_88);
      }
LAB_0085d6d8:
      Pointer::~Pointer((Pointer *)&type_itr);
      return this_local._4_4_;
    }
    pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*
                       ((iterator_template<spvtools::opt::Instruction> *)local_68);
    OVar2 = opt::Instruction::opcode(pIVar6);
    if (OVar2 == OpTypePointer) {
      uVar3 = opt::Instruction::GetSingleWordOperand(pIVar6,2);
      if (uVar3 == type_id) {
        SVar4 = opt::Instruction::GetSingleWordOperand(pIVar6,1);
        if (SVar4 == storage_class) {
          this_local._4_4_ = opt::Instruction::result_id(pIVar6);
          type_inst._M_t.
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = 1;
          goto LAB_0085d6d8;
        }
      }
    }
    InstructionList::iterator::operator++((iterator *)local_68);
  } while( true );
}

Assistant:

uint32_t TypeManager::FindPointerToType(uint32_t type_id,
                                        spv::StorageClass storage_class) {
  Type* pointeeTy = GetType(type_id);
  Pointer pointerTy(pointeeTy, storage_class);

  Module::inst_iterator type_itr = context()->module()->types_values_begin();
  for (; type_itr != context()->module()->types_values_end(); ++type_itr) {
    const Instruction* type_inst = &*type_itr;
    if (type_inst->opcode() == spv::Op::OpTypePointer &&
        type_inst->GetSingleWordOperand(kSpvTypePointerTypeIdInIdx) ==
            type_id &&
        spv::StorageClass(type_inst->GetSingleWordOperand(
            kSpvTypePointerStorageClass)) == storage_class)
      return type_inst->result_id();
  }

  // Must create the pointer type.
  uint32_t resultId = context()->TakeNextId();
  if (resultId == 0) {
    return 0;
  }
  std::unique_ptr<Instruction> type_inst(
      new Instruction(context(), spv::Op::OpTypePointer, 0, resultId,
                      {{spv_operand_type_t::SPV_OPERAND_TYPE_STORAGE_CLASS,
                        {uint32_t(storage_class)}},
                       {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {type_id}}}));
  context()->AddType(std::move(type_inst));
  context()->get_type_mgr()->RegisterType(resultId, pointerTy);
  return resultId;
}